

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O0

int ndiSerialTimeout(int serial_port,int milliseconds)

{
  int iVar1;
  undefined1 local_50 [8];
  termios t;
  int milliseconds_local;
  int serial_port_local;
  
  t.c_ispeed = milliseconds;
  t.c_ospeed = serial_port;
  iVar1 = tcgetattr(serial_port,(termios *)local_50);
  if (iVar1 == -1) {
    milliseconds_local = -1;
  }
  else {
    t.c_lflag._3_1_ = 0;
    t.c_lflag._2_1_ = (undefined1)((int)t.c_ispeed / 100);
    iVar1 = tcsetattr(t.c_ospeed,0,(termios *)local_50);
    if (iVar1 == -1) {
      milliseconds_local = -1;
    }
    else {
      milliseconds_local = 0;
    }
  }
  return milliseconds_local;
}

Assistant:

ndicapiExport int ndiSerialTimeout(int serial_port, int milliseconds)
{
  struct termios t;

  if (tcgetattr(serial_port, &t) == -1)
  {
    return -1;
  }

  t.c_cc[VMIN] = 0;                  /* use constant, not interval timout */
  t.c_cc[VTIME] = milliseconds / 100; /* wait time is in 10ths of a second */

  if (tcsetattr(serial_port, TCSANOW, &t) == -1)
  {
    return -1;
  }

  return 0;
}